

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_encoder.cc
# Opt level: O0

bool __thiscall draco::PlyEncoder::EncodeInternal(PlyEncoder *this)

{
  uint8_t uVar1;
  byte bVar2;
  bool bVar3;
  ValueType VVar4;
  AttributeValueIndex AVar5;
  ostream *poVar6;
  void *pvVar7;
  PointAttribute *pPVar8;
  char *pcVar9;
  const_reference this_00;
  PlyEncoder *in_RDI;
  int c_1;
  PointAttribute *tex_att;
  int c;
  Face *f;
  FaceIndex i;
  PointAttribute *color_att;
  PointAttribute *normal_att;
  PointAttribute *pos_att;
  PointIndex v;
  int num_points;
  string header_str;
  PointAttribute *attribute;
  int color_att_id;
  int tex_coord_att_id;
  int normal_att_id;
  int pos_att_id;
  stringstream out;
  undefined4 in_stack_fffffffffffffa78;
  Type in_stack_fffffffffffffa7c;
  PointCloud *in_stack_fffffffffffffa80;
  GeometryAttribute *in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  PointAttribute *pPVar10;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  EncoderBuffer *in_stack_fffffffffffffaa0;
  PointAttribute *in_stack_fffffffffffffaa8;
  int local_254;
  ValueType local_244;
  int local_240;
  uint local_23c;
  Face *local_238;
  undefined1 local_229;
  ValueType local_228;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_224;
  uint local_220;
  uint local_21c;
  PointAttribute *local_218;
  uint local_210;
  uint local_20c;
  PointAttribute *local_208;
  uint local_200;
  uint local_1fc;
  PointAttribute *local_1f8;
  ValueType local_1ec;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_1e8;
  ValueType local_1e4;
  string local_1e0 [32];
  PointAttribute *local_1c0;
  undefined4 local_1b8;
  int32_t local_1b4;
  int32_t local_1b0;
  int local_1ac;
  int32_t local_1a8;
  stringstream local_198 [16];
  ostream local_188 [391];
  byte local_1;
  AttributeValueIndex att_index;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar6 = std::operator<<(local_188,"ply");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_188,"format binary_little_endian 1.0");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(local_188,"element vertex ");
  VVar4 = PointCloud::num_points(in_RDI->in_point_cloud_);
  pvVar7 = (void *)std::ostream::operator<<(poVar6,VVar4);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  local_1a8 = PointCloud::GetNamedAttributeId(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
  local_1ac = PointCloud::GetNamedAttributeId(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
  local_1b0 = PointCloud::GetNamedAttributeId(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
  local_1b4 = PointCloud::GetNamedAttributeId(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
  if (local_1a8 < 0) {
    local_1 = 0;
    local_1b8 = 1;
  }
  else {
    if (-1 < local_1ac) {
      pPVar8 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      uVar1 = GeometryAttribute::num_components(&pPVar8->super_GeometryAttribute);
      if (uVar1 != '\x03') {
        local_1ac = -1;
      }
    }
    if (-1 < local_1b0) {
      pPVar8 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      uVar1 = GeometryAttribute::num_components(&pPVar8->super_GeometryAttribute);
      if (uVar1 != '\x02') {
        local_1b0 = -1;
      }
    }
    poVar6 = std::operator<<(local_188,"property ");
    pcVar9 = GetAttributeDataType
                       ((PlyEncoder *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                        0);
    poVar6 = std::operator<<(poVar6,pcVar9);
    poVar6 = std::operator<<(poVar6," x");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(local_188,"property ");
    pcVar9 = GetAttributeDataType
                       ((PlyEncoder *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                        0);
    poVar6 = std::operator<<(poVar6,pcVar9);
    poVar6 = std::operator<<(poVar6," y");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(local_188,"property ");
    pcVar9 = GetAttributeDataType
                       ((PlyEncoder *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                        0);
    poVar6 = std::operator<<(poVar6,pcVar9);
    poVar6 = std::operator<<(poVar6," z");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    if (-1 < local_1ac) {
      poVar6 = std::operator<<(local_188,"property ");
      pcVar9 = GetAttributeDataType
                         ((PlyEncoder *)
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::operator<<(poVar6," nx");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(local_188,"property ");
      pcVar9 = GetAttributeDataType
                         ((PlyEncoder *)
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::operator<<(poVar6," ny");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(local_188,"property ");
      pcVar9 = GetAttributeDataType
                         ((PlyEncoder *)
                          CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
      poVar6 = std::operator<<(poVar6,pcVar9);
      poVar6 = std::operator<<(poVar6," nz");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    if (-1 < local_1b4) {
      local_1c0 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      uVar1 = GeometryAttribute::num_components(&local_1c0->super_GeometryAttribute);
      if (uVar1 != '\0') {
        poVar6 = std::operator<<(local_188,"property ");
        pcVar9 = GetAttributeDataType
                           ((PlyEncoder *)
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6," red");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      bVar2 = GeometryAttribute::num_components(&local_1c0->super_GeometryAttribute);
      if (1 < bVar2) {
        poVar6 = std::operator<<(local_188,"property ");
        pcVar9 = GetAttributeDataType
                           ((PlyEncoder *)
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6," green");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      bVar2 = GeometryAttribute::num_components(&local_1c0->super_GeometryAttribute);
      if (2 < bVar2) {
        poVar6 = std::operator<<(local_188,"property ");
        pcVar9 = GetAttributeDataType
                           ((PlyEncoder *)
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6," blue");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      bVar2 = GeometryAttribute::num_components(&local_1c0->super_GeometryAttribute);
      if (3 < bVar2) {
        poVar6 = std::operator<<(local_188,"property ");
        pcVar9 = GetAttributeDataType
                           ((PlyEncoder *)
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6," alpha");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    if (in_RDI->in_mesh_ != (Mesh *)0x0) {
      poVar6 = std::operator<<(local_188,"element face ");
      VVar4 = Mesh::num_faces((Mesh *)0x14254a);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,VVar4);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(local_188,"property list uchar int vertex_indices");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      if (-1 < local_1b0) {
        poVar6 = std::operator<<(local_188,"property list uchar ");
        pcVar9 = GetAttributeDataType
                           ((PlyEncoder *)
                            CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),0);
        poVar6 = std::operator<<(poVar6,pcVar9);
        poVar6 = std::operator<<(poVar6," texcoord");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    poVar6 = std::operator<<(local_188,"end_header");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::stringstream::str();
    buffer(in_RDI);
    std::__cxx11::string::data();
    std::__cxx11::string::length();
    EncoderBuffer::Encode
              ((EncoderBuffer *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
               CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    local_1e4 = PointCloud::num_points(in_RDI->in_point_cloud_);
    IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_1e8,0);
    while( true ) {
      local_1ec = local_1e4;
      bVar3 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<(&local_1e8,&local_1ec)
      ;
      if (!bVar3) break;
      local_1f8 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
      buffer(in_RDI);
      local_200 = local_1e8.value_;
      local_1fc = (uint)PointAttribute::mapped_index
                                  ((PointAttribute *)
                                   CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                                   (PointIndex)(uint)in_stack_fffffffffffffa80);
      GeometryAttribute::GetAddress
                (in_stack_fffffffffffffa88,
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffa90 >> 0x20));
      GeometryAttribute::byte_stride(&local_1f8->super_GeometryAttribute);
      EncoderBuffer::Encode
                ((EncoderBuffer *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                 CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      if (-1 < local_1ac) {
        local_208 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
        buffer(in_RDI);
        local_210 = local_1e8.value_;
        local_20c = (uint)PointAttribute::mapped_index
                                    ((PointAttribute *)
                                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                                     (PointIndex)(uint)in_stack_fffffffffffffa80);
        GeometryAttribute::GetAddress
                  (in_stack_fffffffffffffa88,
                   (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffa90 >> 0x20));
        GeometryAttribute::byte_stride(&local_208->super_GeometryAttribute);
        EncoderBuffer::Encode
                  ((EncoderBuffer *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      }
      if (-1 < local_1b4) {
        local_218 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
        buffer(in_RDI);
        local_220 = local_1e8.value_;
        local_21c = (uint)PointAttribute::mapped_index
                                    ((PointAttribute *)
                                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                                     (PointIndex)(uint)in_stack_fffffffffffffa80);
        GeometryAttribute::GetAddress
                  (in_stack_fffffffffffffa88,
                   (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffa90 >> 0x20));
        GeometryAttribute::byte_stride(&local_218->super_GeometryAttribute);
        EncoderBuffer::Encode
                  ((EncoderBuffer *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      }
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_1e8);
    }
    if (in_RDI->in_mesh_ != (Mesh *)0x0) {
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_224,0);
      while( true ) {
        local_228 = Mesh::num_faces((Mesh *)0x142a94);
        bVar3 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                          (&local_224,&local_228);
        if (!bVar3) break;
        buffer(in_RDI);
        local_229 = 3;
        EncoderBuffer::Encode<unsigned_char>
                  ((EncoderBuffer *)in_stack_fffffffffffffaa8,(uchar *)in_stack_fffffffffffffaa0);
        local_23c = local_224.value_;
        local_238 = Mesh::face((Mesh *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78)
                               ,(FaceIndex)(uint)((ulong)in_stack_fffffffffffffa80 >> 0x20));
        for (local_240 = 0; local_240 < 3; local_240 = local_240 + 1) {
          this_00 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                    operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                *)in_stack_fffffffffffffa80,
                               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          local_244 = local_1e4;
          bVar3 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator>=
                            (this_00,&local_244);
          if (bVar3) {
            local_1 = 0;
            goto LAB_00142d66;
          }
          buffer(in_RDI);
          std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                    ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                     in_stack_fffffffffffffa80,
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
          EncoderBuffer::Encode<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>>
                    ((EncoderBuffer *)in_stack_fffffffffffffaa8,
                     (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                     in_stack_fffffffffffffaa0);
        }
        if (-1 < local_1b0) {
          buffer(in_RDI);
          EncoderBuffer::Encode<unsigned_char>
                    ((EncoderBuffer *)in_stack_fffffffffffffaa8,(uchar *)in_stack_fffffffffffffaa0);
          pPVar8 = PointCloud::attribute(in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
          in_stack_fffffffffffffaa8 = pPVar8;
          for (local_254 = 0; local_254 < 3; local_254 = local_254 + 1) {
            in_stack_fffffffffffffaa0 = buffer(in_RDI);
            pPVar10 = pPVar8;
            std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                      ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                       in_stack_fffffffffffffa80,
                       CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
            att_index.value_ = (uint)((ulong)pPVar10 >> 0x20);
            AVar5 = PointAttribute::mapped_index
                              ((PointAttribute *)
                               CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                               (uint)in_stack_fffffffffffffa80);
            in_stack_fffffffffffffa88 =
                 (GeometryAttribute *)
                 GeometryAttribute::GetAddress(in_stack_fffffffffffffa88,att_index);
            in_stack_fffffffffffffa80 =
                 (PointCloud *)GeometryAttribute::byte_stride(&pPVar8->super_GeometryAttribute);
            EncoderBuffer::Encode
                      ((EncoderBuffer *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                       CONCAT44(AVar5.value_,in_stack_fffffffffffffa98));
          }
        }
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_224);
      }
    }
    local_1 = 1;
LAB_00142d66:
    local_1b8 = 1;
    std::__cxx11::string::~string(local_1e0);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return (bool)(local_1 & 1);
}

Assistant:

bool PlyEncoder::EncodeInternal() {
  // Write PLY header.
  // TODO(ostava): Currently works only for xyz positions and rgb(a) colors.
  std::stringstream out;
  out << "ply" << std::endl;
  out << "format binary_little_endian 1.0" << std::endl;
  out << "element vertex " << in_point_cloud_->num_points() << std::endl;

  const int pos_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::POSITION);
  int normal_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::NORMAL);
  int tex_coord_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::TEX_COORD);
  const int color_att_id =
      in_point_cloud_->GetNamedAttributeId(GeometryAttribute::COLOR);

  if (pos_att_id < 0) {
    return false;
  }

  // Ensure normals are 3 component. Don't encode them otherwise.
  if (normal_att_id >= 0 &&
      in_point_cloud_->attribute(normal_att_id)->num_components() != 3) {
    normal_att_id = -1;
  }

  // Ensure texture coordinates have only 2 components. Don't encode them
  // otherwise. TODO(ostava): Add support for 3 component normals (uvw).
  if (tex_coord_att_id >= 0 &&
      in_point_cloud_->attribute(tex_coord_att_id)->num_components() != 2) {
    tex_coord_att_id = -1;
  }

  out << "property " << GetAttributeDataType(pos_att_id) << " x" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " y" << std::endl;
  out << "property " << GetAttributeDataType(pos_att_id) << " z" << std::endl;
  if (normal_att_id >= 0) {
    out << "property " << GetAttributeDataType(normal_att_id) << " nx"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " ny"
        << std::endl;
    out << "property " << GetAttributeDataType(normal_att_id) << " nz"
        << std::endl;
  }
  if (color_att_id >= 0) {
    const auto *const attribute = in_point_cloud_->attribute(color_att_id);
    if (attribute->num_components() > 0) {
      out << "property " << GetAttributeDataType(color_att_id) << " red"
          << std::endl;
    }
    if (attribute->num_components() > 1) {
      out << "property " << GetAttributeDataType(color_att_id) << " green"
          << std::endl;
    }
    if (attribute->num_components() > 2) {
      out << "property " << GetAttributeDataType(color_att_id) << " blue"
          << std::endl;
    }
    if (attribute->num_components() > 3) {
      out << "property " << GetAttributeDataType(color_att_id) << " alpha"
          << std::endl;
    }
  }
  if (in_mesh_) {
    out << "element face " << in_mesh_->num_faces() << std::endl;
    out << "property list uchar int vertex_indices" << std::endl;
    if (tex_coord_att_id >= 0) {
      // Texture coordinates are usually encoded in the property list (one value
      // per corner).
      out << "property list uchar " << GetAttributeDataType(tex_coord_att_id)
          << " texcoord" << std::endl;
    }
  }
  out << "end_header" << std::endl;

  // Not very efficient but the header should be small so just copy the stream
  // to a string.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  // Store point attributes.
  const int num_points = in_point_cloud_->num_points();
  for (PointIndex v(0); v < num_points; ++v) {
    const auto *const pos_att = in_point_cloud_->attribute(pos_att_id);
    buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(v)),
                     pos_att->byte_stride());
    if (normal_att_id >= 0) {
      const auto *const normal_att = in_point_cloud_->attribute(normal_att_id);
      buffer()->Encode(normal_att->GetAddress(normal_att->mapped_index(v)),
                       normal_att->byte_stride());
    }
    if (color_att_id >= 0) {
      const auto *const color_att = in_point_cloud_->attribute(color_att_id);
      buffer()->Encode(color_att->GetAddress(color_att->mapped_index(v)),
                       color_att->byte_stride());
    }
  }

  if (in_mesh_) {
    // Write face data.
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      // Write the number of face indices (always 3).
      buffer()->Encode(static_cast<uint8_t>(3));

      const auto &f = in_mesh_->face(i);
      for (int c = 0; c < 3; ++c) {
        if (f[c] >= num_points) {
          // Invalid point stored on the |in_mesh_| face.
          return false;
        }
        buffer()->Encode(f[c]);
      }

      if (tex_coord_att_id >= 0) {
        // Two coordinates for every corner -> 6.
        buffer()->Encode(static_cast<uint8_t>(6));

        const auto *const tex_att =
            in_point_cloud_->attribute(tex_coord_att_id);
        for (int c = 0; c < 3; ++c) {
          buffer()->Encode(tex_att->GetAddress(tex_att->mapped_index(f[c])),
                           tex_att->byte_stride());
        }
      }
    }
  }
  return true;
}